

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O2

suffix_table_type * __thiscall
frozen::boyer_moore_searcher<5UL>::build_suffix_table
          (suffix_table_type *__return_storage_ptr__,boyer_moore_searcher<5UL> *this,
          char (*needle) [6])

{
  bool bVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  suffix_table_type suffix;
  
  suffix.data_[2] = 0;
  suffix.data_[3] = 0;
  suffix.data_[4] = 0;
  suffix.data_[0] = 0;
  suffix.data_[1] = 0;
  lVar2 = 0;
  sVar3 = 4;
  for (sVar4 = sVar3; -1 < (long)sVar4; sVar4 = sVar4 - 1) {
    bVar1 = is_prefix(this,needle,sVar4 + 1);
    if (bVar1) {
      sVar3 = sVar4 + 1;
    }
    suffix.data_[sVar4] = sVar3 + lVar2;
    lVar2 = lVar2 + 1;
  }
  sVar3 = 0;
  lVar2 = 4;
  while (lVar2 != 0) {
    sVar4 = suffix_length(this,needle,sVar3);
    if (*(char *)((long)needle + (sVar3 - sVar4)) != *(char *)((long)needle + (4 - sVar4))) {
      *(size_t *)((long)&suffix + (4 - sVar4) * 8) = sVar4 + lVar2;
    }
    sVar3 = sVar3 + 1;
    lVar2 = lVar2 + -1;
  }
  __return_storage_ptr__->data_[4] = suffix.data_[4];
  __return_storage_ptr__->data_[2] = suffix.data_[2];
  __return_storage_ptr__->data_[3] = suffix.data_[3];
  __return_storage_ptr__->data_[0] = suffix.data_[0];
  __return_storage_ptr__->data_[1] = suffix.data_[1];
  return __return_storage_ptr__;
}

Assistant:

constexpr auto build_suffix_table(char const (&needle)[size + 1]) {
    suffix_table_type suffix;
    std::ptrdiff_t last_prefix_index = size - 1;

    // first loop
    for (std::ptrdiff_t p = size - 1; p >= 0; p--) {
      if (is_prefix(needle, p + 1))
        last_prefix_index = p + 1;

      suffix[p] = last_prefix_index + (size - 1 - p);
    }

    // second loop
    for (std::size_t p = 0; p < size - 1; p++) {
      auto slen = suffix_length(needle, p);
      if (needle[p - slen] != needle[size - 1 - slen])
        suffix[size - 1 - slen] = size - 1 - p + slen;

    }
    return suffix;
  }